

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O3

void CDIVID(double *AR,double *AI,double *BR,double *BI,double INFINY,double *CR,double *CI)

{
  double dVar1;
  double in_XMM1_Qa;
  double dVar2;
  
  dVar1 = *BR;
  if ((((INFINY == 0.0) && (!NAN(INFINY))) && (dVar1 == 0.0)) && (!NAN(dVar1))) {
    *CR = in_XMM1_Qa;
    *BI = in_XMM1_Qa;
    return;
  }
  if (ABS(dVar1) <= ABS(INFINY)) {
    dVar2 = dVar1 / INFINY;
    dVar1 = dVar1 * dVar2 + INFINY;
    *BI = (*AI * dVar2 + *AR) / dVar1;
    *CR = (*AI - dVar2 * *AR) / dVar1;
  }
  else {
    dVar2 = INFINY / dVar1;
    dVar1 = INFINY * dVar2 + dVar1;
    *BI = (*AR * dVar2 + *AI) / dVar1;
    *CR = (dVar2 * *AI - *AR) / dVar1;
  }
  return;
}

Assistant:

static void CDIVID(double *AR, double *AI, double *BR, double *BI, double INFINY, double *CR, double *CI) {
	// C COMPLEX DIVISION C = A/B, AVOIDING OVERFLOW.
	double INFIN,R,D;
	if ( !(*BR != 0.0 || *BI != 0.0) ) {
		INFIN = INFINY;
		*CR = *CI = INFIN;
	}
	else {
		if (fabs(*BR) < fabs(*BI)) {
			R = *BR / *BI;
			D = *BI + R * *BR;
			*CR = (*AR*R + *AI) / D;
			*CI = (*AI*R - *AR) / D;
		}
		else {
			R = *BI / *BR;
			D = *BR + R * *BI;
			*CR = (*AR + *AI*R) / D;
			*CI = (*AI - *AR*R) / D;
		}
	}

}